

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreewidget.cpp
# Opt level: O3

bool __thiscall QTreeModel::clearItemData(QTreeModel *this,QModelIndex *index)

{
  int iVar1;
  quintptr qVar2;
  char cVar3;
  bool bVar4;
  pointer pQVar5;
  pointer pQVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  long in_FS_OFFSET;
  anon_union_24_3_e3d07ef4_for_data local_58;
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  cVar3 = QAbstractItemModel::checkIndex(this,index,1);
  if (cVar3 != '\0') {
    qVar2 = index->i;
    if ((qVar2 != 0 && (index->m).ptr != (QAbstractItemModel *)0x0) && -1 < (index->r | index->c)) {
      uVar13 = (ulong)(uint)index->c;
      lVar7 = *(long *)(*(long *)(qVar2 + 0x18) + 8 + uVar13 * 0x18);
      lVar12 = *(long *)(*(long *)(qVar2 + 0x18) + 0x10 + uVar13 * 0x18);
      lVar11 = lVar7 + lVar12 * 0x28;
      lVar9 = lVar12 >> 2;
      if (0 < lVar9) {
        lVar10 = lVar9 + 1;
        lVar8 = lVar7 + 0x50;
        do {
          if (3 < *(ulong *)(lVar8 + -0x30)) {
            lVar8 = lVar8 + -0x50;
            goto LAB_005ad01d;
          }
          if (3 < *(ulong *)(lVar8 + -8)) {
            lVar8 = lVar8 + -0x28;
            goto LAB_005ad01d;
          }
          if (3 < *(ulong *)(lVar8 + 0x20)) goto LAB_005ad01d;
          if (3 < *(ulong *)(lVar8 + 0x48)) {
            lVar8 = lVar8 + 0x28;
            goto LAB_005ad01d;
          }
          lVar10 = lVar10 + -1;
          lVar8 = lVar8 + 0xa0;
        } while (1 < lVar10);
        lVar12 = (lVar12 * 0x28 + lVar9 * -0xa0 >> 3) * -0x3333333333333333;
        lVar7 = lVar7 + lVar9 * 0xa0;
      }
      if (lVar12 == 1) {
LAB_005acfff:
        lVar8 = lVar7;
        if (*(ulong *)(lVar7 + 0x20) < 4) {
          lVar8 = lVar11;
        }
LAB_005ad01d:
        if (lVar8 == lVar11) goto LAB_005ad028;
        lVar11 = *(long *)(qVar2 + 0x30);
      }
      else {
        if (lVar12 == 2) {
LAB_005acff4:
          lVar8 = lVar7;
          if (*(ulong *)(lVar7 + 0x20) < 4) {
            lVar7 = lVar7 + 0x28;
            goto LAB_005acfff;
          }
          goto LAB_005ad01d;
        }
        if (lVar12 == 3) {
          lVar8 = lVar7;
          if (*(ulong *)(lVar7 + 0x20) < 4) {
            lVar7 = lVar7 + 0x28;
            goto LAB_005acff4;
          }
          goto LAB_005ad01d;
        }
LAB_005ad028:
        lVar11 = *(long *)(qVar2 + 0x30);
        bVar4 = true;
        if (*(ulong *)(*(long *)(lVar11 + 0x10) + 0x18 + uVar13 * 0x20) < 4) goto LAB_005ad0e0;
      }
      local_58.shared = (PrivateShared *)0x0;
      local_58._8_8_ = 0;
      local_58._16_8_ = 0;
      local_40 = 2;
      pQVar5 = QList<QVariant>::data((QList<QVariant> *)(lVar11 + 8));
      ::QVariant::operator=(pQVar5 + uVar13,(QVariant *)&local_58);
      ::QVariant::~QVariant((QVariant *)&local_58);
      iVar1 = index->c;
      pQVar6 = QList<QList<QWidgetItemData>_>::data
                         ((QList<QList<QWidgetItemData>_> *)(qVar2 + 0x10));
      QList<QWidgetItemData>::clear(pQVar6 + iVar1);
      local_58._16_8_ = 0;
      local_58.shared = (PrivateShared *)0x0;
      local_58._8_8_ = 0;
      QAbstractItemModel::dataChanged((QModelIndex *)this,index,(QList_conflict *)index);
      if ((QArrayData *)local_58.shared != (QArrayData *)0x0) {
        LOCK();
        *(int *)local_58.shared = *(int *)local_58.shared + -1;
        UNLOCK();
        if (*(int *)local_58.shared == 0) {
          QArrayData::deallocate((QArrayData *)local_58.shared,4,0x10);
        }
      }
      bVar4 = true;
      goto LAB_005ad0e0;
    }
  }
  bVar4 = false;
LAB_005ad0e0:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar4;
}

Assistant:

bool QTreeModel::clearItemData(const QModelIndex &index)
{
    if (!checkIndex(index, CheckIndexOption::IndexIsValid))
        return false;
    QTreeWidgetItem *itm = item(index);
    if (!itm)
        return false;
    const auto beginIter = itm->values.at(index.column()).cbegin();
    const auto endIter = itm->values.at(index.column()).cend();
    if (std::all_of(beginIter, endIter, [](const QWidgetItemData& data) -> bool { return !data.value.isValid(); })
        && !itm->d->display.at(index.column()).isValid()) {
        return true; //it's already cleared
    }
    itm->d->display[index.column()] = QVariant();
    itm->values[index.column()].clear();
    emit dataChanged(index, index, QList<int> {});
    return true;
}